

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_loader_impl.c
# Opt level: O1

int mock_loader_impl_destroy(loader_impl impl)

{
  void *__ptr;
  
  __ptr = (void *)loader_impl_get();
  if (__ptr != (void *)0x0) {
    loader_unload_children(impl);
    free(__ptr);
  }
  return (uint)(__ptr == (void *)0x0);
}

Assistant:

int mock_loader_impl_destroy(loader_impl impl)
{
	loader_impl_mock mock_impl = loader_impl_get(impl);

	if (mock_impl != NULL)
	{
		/* Destroy children loaders */
		loader_unload_children(impl);

		/* Destroy Mock */
		free(mock_impl);

		return 0;
	}

	return 1;
}